

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O0

HelicsBool helicsDataBufferConvertToType(HelicsDataBuffer data,int newDataType)

{
  DataType in_ESI;
  defV *in_stack_00000020;
  DataType in_stack_0000002c;
  data_view *in_stack_00000030;
  defV oVal;
  DataType type;
  SmallBuffer *ptr;
  SmallBuffer *this;
  HelicsDataBuffer in_stack_ffffffffffffff18;
  SmallBuffer *in_stack_ffffffffffffff28;
  data_view *in_stack_ffffffffffffff30;
  SmallBuffer *in_stack_ffffffffffffff40;
  SmallBuffer *in_stack_ffffffffffffff48;
  defV *in_stack_ffffffffffffff50;
  DataType in_stack_ffffffffffffff5c;
  undefined1 local_58 [68];
  DataType local_14;
  HelicsBool local_4;
  
  local_14 = in_ESI;
  local_58._56_8_ = getBuffer(in_stack_ffffffffffffff18);
  if ((SmallBuffer *)local_58._56_8_ == (SmallBuffer *)0x0) {
    local_4 = 0;
  }
  else {
    helics::SmallBuffer::data((SmallBuffer *)local_58._56_8_);
    local_58._52_4_ = helics::detail::detectType((byte *)in_stack_ffffffffffffff28);
    if (local_58._52_4_ == local_14) {
      local_4 = 1;
    }
    else {
      this = (SmallBuffer *)local_58;
      std::
      variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                 *)0x1f5094);
      helics::data_view::data_view(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      helics::valueExtract(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
      helics::data_view::~data_view((data_view *)0x1f50cf);
      helics::typeConvertDefV(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50);
      helics::SmallBuffer::operator=(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      helics::SmallBuffer::~SmallBuffer(this);
      local_4 = 1;
      std::
      variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                  *)0x1f511e);
    }
  }
  return local_4;
}

Assistant:

HelicsBool helicsDataBufferConvertToType(HelicsDataBuffer data, int newDataType)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return HELICS_FALSE;
    }
    auto type = helics::detail::detectType(ptr->data());
    if (static_cast<int>(type) == newDataType) {
        return HELICS_TRUE;
    }
    helics::defV oVal;
    helics::valueExtract(*ptr, helics::DataType::HELICS_ANY, oVal);
    *ptr = helics::typeConvertDefV(static_cast<helics::DataType>(newDataType), oVal);
    return HELICS_TRUE;
}